

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operands.c
# Opt level: O0

int operands_extract_modrm
              (_CodeInfo *ci,_PrefixState *ps,_DInst *di,_DecodeType effAdrSz,uint mod,uint rm,
              _iflags instFlags,_Operand *op)

{
  int iVar1;
  _DecodeType in_ECX;
  _DInst *in_RDX;
  _PrefixState *in_RSI;
  _CodeInfo *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uchar base;
  uint in_stack_00000008;
  uchar sib;
  uint8_t local_2e;
  byte local_2d;
  uint local_2c;
  uint local_28;
  _DecodeType local_24;
  _DInst *local_20;
  _PrefixState *local_18;
  _CodeInfo *local_10;
  
  local_2d = 0;
  in_RSI->usedPrefixes = in_RSI->usedPrefixes | 0x4000;
  if (((in_stack_00000008 & 0x10) != 0) && ((in_RSI->decodedPrefixes & 0x10) != 0)) {
    in_RSI->usedPrefixes = in_RSI->usedPrefixes | 0x10;
    in_RDX->flags = in_RDX->flags | 1;
  }
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_ECX == Decode16Bits) {
    if ((in_R8D == 0) && (in_R9D == 6)) {
      *(undefined1 *)CONCAT44(effAdrSz,mod) = 5;
      in_RDX->dispSize = '\x10';
      iVar1 = read_stream_safe_sint16(in_RDI,(int64_t *)&in_RDX->disp);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      if (in_R9D < 4) {
        *(undefined1 *)CONCAT44(effAdrSz,mod) = 7;
        in_RDX->base = operands_extract_modrm::MODS[in_R9D];
        in_RDX->usedRegistersMask =
             _REGISTERTORCLASS[operands_extract_modrm::MODS[in_R9D]] | in_RDX->usedRegistersMask;
        *(uint8_t *)(CONCAT44(effAdrSz,mod) + 1) = operands_extract_modrm::MODS2[in_R9D];
      }
      else {
        *(undefined1 *)CONCAT44(effAdrSz,mod) = 6;
        *(uint8_t *)(CONCAT44(effAdrSz,mod) + 1) = operands_extract_modrm::MODS[in_R9D];
      }
      if (in_R8D == 1) {
        in_RDX->dispSize = '\b';
        iVar1 = read_stream_safe_sint8(in_RDI,(int64_t *)&in_RDX->disp);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else if (in_R8D == 2) {
        in_RDX->dispSize = '\x10';
        iVar1 = read_stream_safe_sint16(in_RDI,(int64_t *)&in_RDX->disp);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
    if (((local_2c == 2) || (local_2c == 3)) || ((local_2c == 6 && (local_28 != 0)))) {
      prefixes_use_segment(0x100,local_18,local_10->dt,local_20);
    }
    else {
      prefixes_use_segment(0x200,local_18,local_10->dt,local_20);
    }
  }
  else if ((in_R9D == 5) && (in_R8D == 0)) {
    in_RDX->dispSize = ' ';
    iVar1 = read_stream_safe_sint32(in_RDI,(int64_t *)&in_RDX->disp);
    if (iVar1 == 0) {
      return 0;
    }
    *(undefined1 *)CONCAT44(effAdrSz,mod) = 5;
    if (local_10->dt == Decode64Bits) {
      *(undefined1 *)CONCAT44(effAdrSz,mod) = 6;
      *(undefined1 *)(CONCAT44(effAdrSz,mod) + 1) = 0x4a;
      local_20->flags = local_20->flags | 0x80;
    }
    prefixes_use_segment(0x200,local_18,local_10->dt,local_20);
  }
  else {
    if (in_R9D == 4) {
      local_24 = in_ECX;
      iVar1 = read_stream_safe_uint8(in_RDI,&local_2d);
      if (iVar1 == 0) {
        return 0;
      }
      operands_extract_sib
                (local_20,local_18,local_24,(uint)local_2d,local_28,
                 (_Operand *)CONCAT44(effAdrSz,mod));
    }
    else {
      *(undefined1 *)CONCAT44(effAdrSz,mod) = 6;
      if ((in_RSI->vrex & 1) != 0) {
        in_RSI->usedPrefixes = in_RSI->usedPrefixes | 0x2000000;
        local_2c = in_R9D + 8;
      }
      if (in_ECX == Decode64Bits) {
        *(char *)(CONCAT44(effAdrSz,mod) + 1) = (char)local_2c;
      }
      else {
        *(char *)(CONCAT44(effAdrSz,mod) + 1) = (char)local_2c + '\x10';
      }
    }
    if (local_28 == 1) {
      local_20->dispSize = '\b';
      iVar1 = read_stream_safe_sint8(local_10,(int64_t *)&local_20->disp);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else if ((local_28 == 2) || ((local_2d & 7) == 5)) {
      local_20->dispSize = ' ';
      iVar1 = read_stream_safe_sint32(local_10,(int64_t *)&local_20->disp);
      if (iVar1 == 0) {
        return 0;
      }
    }
    local_2e = *(uint8_t *)(CONCAT44(effAdrSz,mod) + 1);
    if (local_20->base == 0xff) {
      if (1 < local_20->scale) {
        local_2e = '\0';
      }
    }
    else {
      local_2e = local_20->base;
    }
    if ((local_2e == '\x15') || (local_2e == '\x14')) {
      prefixes_use_segment(0x100,local_18,local_10->dt,local_20);
    }
    else {
      prefixes_use_segment(0x200,local_18,local_10->dt,local_20);
    }
  }
  return 1;
}

Assistant:

static int operands_extract_modrm(_CodeInfo* ci, _PrefixState* ps, _DInst* di,
                                  _DecodeType effAdrSz, unsigned int mod, unsigned int rm,
                                  _iflags instFlags, _Operand* op)
{
	unsigned char sib = 0, base = 0;

	/* Memory indirection decoding ahead:) */

	ps->usedPrefixes |= INST_PRE_ADDR_SIZE;
	if ((instFlags & INST_PRE_LOCK) && (ps->decodedPrefixes & INST_PRE_LOCK)) {
		ps->usedPrefixes |= INST_PRE_LOCK;
		di->flags |= FLAG_LOCK;
	}

	if (effAdrSz != Decode16Bits) { /* Decode32Bits or Decode64Bits! */
		/* Remember that from a 32/64 bits ModR/M byte a SIB byte could follow! */
		if ((rm == 5) && (mod == 0)) {
			/* 5 is a special case - only 32 bits displacement, or RIP relative. */
			di->dispSize = 32;
			if (!read_stream_safe_sint32(ci, (int64_t*)&di->disp)) return FALSE;

			/* Absolute address: */
			op->type = O_DISP;

			if (ci->dt == Decode64Bits) {
				/* In 64 bits decoding mode depsite of the address size, a RIP-relative address it is. */
				op->type = O_SMEM;
				op->index = R_RIP;
				di->flags |= FLAG_RIP_RELATIVE;
			}

			prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
		else {
			if (rm == 4) {
				/* 4 is a special case - SIB byte + disp8/32 follows! */
				/* Read SIB byte. */
				if (!read_stream_safe_uint8(ci, &sib)) return FALSE;
				operands_extract_sib(di, ps, effAdrSz, sib, mod, op);
			}
			else {
				op->type = O_SMEM;
				if (ps->vrex & PREFIX_EX_B) {
					ps->usedPrefixes |= INST_PRE_REX;
					rm += EX_GPR_BASE;
				}

				if (effAdrSz == Decode64Bits) op->index = (uint8_t)(REGS64_BASE + rm);
				else op->index = (uint8_t)(REGS32_BASE + rm);
			}

			if (mod == 1) {
				di->dispSize = 8;
				if (!read_stream_safe_sint8(ci, (int64_t*)&di->disp)) return FALSE;
			}
			else if ((mod == 2) || ((sib & 7) == 5)) { /* If there is no BASE, read DISP32! */
				di->dispSize = 32;
				if (!read_stream_safe_sint32(ci, (int64_t*)&di->disp)) return FALSE;
			}

			/* Get the base register. */
			base = op->index;
			if (di->base != R_NONE) base = di->base;
			else if (di->scale >= 2) base = 0; /* If it's only an index but got scale, it's still DS. */
			/* Default for EBP/ESP is SS segment. 64 bits mode ignores DS anyway. */
			if ((base == R_EBP) || (base == R_ESP)) prefixes_use_segment(INST_PRE_SS, ps, ci->dt, di);
			else prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
	}
	else { /* Decode16Bits */
		/* Decoding according to Table 2-1. (16 bits) */
		if ((mod == 0) && (rm == 6)) {
			/* 6 is a special case - only 16 bits displacement. */
			op->type = O_DISP;
			di->dispSize = 16;
			if (!read_stream_safe_sint16(ci, (int64_t*)&di->disp)) return FALSE;
		}
		else {
			/*
			 * Create the O_MEM for 16 bits indirection that requires 2 registers, E.G: [BS+SI].
			 * or create O_SMEM for a single register indirection, E.G: [BP].
			 */
			static uint8_t MODS[] = { R_BX, R_BX, R_BP, R_BP, R_SI, R_DI, R_BP, R_BX };
			static uint8_t MODS2[] = { R_SI, R_DI, R_SI, R_DI };
			if (rm < 4) {
				op->type = O_MEM;
				di->base = MODS[rm];
				di->usedRegistersMask |= _REGISTERTORCLASS[MODS[rm]];
				op->index = MODS2[rm];
			}
			else {
				op->type = O_SMEM;
				op->index = MODS[rm];
			}

			if (mod == 1) { /* 8 bits displacement + indirection */
				di->dispSize = 8;
				if (!read_stream_safe_sint8(ci, (int64_t*)&di->disp)) return FALSE;
			}
			else if (mod == 2) { /* 16 bits displacement + indirection */
				di->dispSize = 16;
				if (!read_stream_safe_sint16(ci, (int64_t*)&di->disp)) return FALSE;
			}
		}

		if ((rm == 2) || (rm == 3) || ((rm == 6) && (mod != 0))) {
			/* BP's default segment is SS, so ignore it. */
			prefixes_use_segment(INST_PRE_SS, ps, ci->dt, di);
		}
		else {
			/* Ignore default DS segment. */
			prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
	}

	return TRUE;
}